

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O2

void __thiscall
mp::BasicExprFactory<std::allocator<char>_>::PLTermBuilder::AddSlope
          (PLTermBuilder *this,double slope)

{
  int iVar1;
  AssertionFailure *this_00;
  
  iVar1 = this->slope_index_;
  if (iVar1 <= this->impl_->num_breakpoints) {
    this->impl_->data[(long)iVar1 * 2] = slope;
    this->slope_index_ = iVar1 + 1;
    return;
  }
  this_00 = (AssertionFailure *)__cxa_allocate_exception(0x10);
  AssertionFailure::AssertionFailure(this_00,"too many slopes");
  __cxa_throw(this_00,&AssertionFailure::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void AddSlope(double slope) {
      MP_ASSERT(slope_index_ < impl_->num_breakpoints + 1, "too many slopes");
      impl_->data[2 * slope_index_] = slope;
      ++slope_index_;
    }